

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O2

void aalcalcmeanonly::OutputRows(bool skipHeader,bool ordOutput,string *parquetOutFile)

{
  if (parquetOutFile->_M_string_length == 0 || ordOutput) {
    WriteCsvOutputFile(skipHeader,ordOutput);
    return;
  }
  return;
}

Assistant:

void OutputRows(const bool skipHeader, const bool ordOutput,
		  const std::string& parquetOutFile) {
  /* !parquetOutfile.empty() | ordOutput | output files
  * ---------------------------------------------------
  *            1             |     1     | ORD parquet and csv
  *            1             |     0     | ORD parquet
  *            0             |     1     | ORD csv
  *            0             |     0     | legacy csv
  */

    if (!(!parquetOutFile.empty() && !ordOutput)) {
      WriteCsvOutputFile(skipHeader, ordOutput);
    }

#ifdef HAVE_PARQUET
    if (!parquetOutFile.empty()) WriteParquetOutputFile(parquetOutFile);
#endif

  }